

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O3

char * Timidity::SourceToString(USHORT usSource)

{
  char *pcVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,usSource);
  if (iVar2 < 0x81) {
    switch(CONCAT62(in_register_0000003a,usSource) & 0xffffffff) {
    case 0:
      pcVar1 = "NONE";
      break;
    case 1:
      pcVar1 = "LFO";
      break;
    case 2:
      pcVar1 = "KEYONVELOCITY";
      break;
    case 3:
      pcVar1 = "KEYNUMBER";
      break;
    case 4:
      pcVar1 = "EG1";
      break;
    case 5:
      pcVar1 = "EG2";
      break;
    case 6:
      pcVar1 = "PITCHWHEEL";
      break;
    case 7:
      pcVar1 = "POLYPRESSURE";
      break;
    case 8:
      pcVar1 = "CHANNELPRESSURE";
      break;
    case 9:
      pcVar1 = "VIBRATO";
      break;
    case 10:
      pcVar1 = "MONOPRESSURE";
      break;
    default:
      goto switchD_00328551_default;
    }
  }
  else {
    if (iVar2 < 0x8b) {
      if (iVar2 == 0x81) {
        return "CC1";
      }
      if (iVar2 == 0x87) {
        return "CC7";
      }
      if (iVar2 == 0x8a) {
        return "CC10";
      }
    }
    else {
      if (iVar2 == 0x8b) {
        return "CC11";
      }
      if (iVar2 == 0xdb) {
        return "CC91";
      }
      if (iVar2 == 0xdd) {
        return "CC93";
      }
    }
switchD_00328551_default:
    pcVar1 = SourceToString::unknown;
    mysnprintf(SourceToString::unknown,0x20,"UNKNOWN (0x%04x)",usSource);
  }
  return pcVar1;
}

Assistant:

static const char *SourceToString(USHORT usSource)
{
	static char unknown[32];
	switch(usSource) {
		case CONN_SRC_NONE:
			return "NONE";
		case CONN_SRC_LFO:
			return "LFO";
		case CONN_SRC_KEYONVELOCITY:
			return "KEYONVELOCITY";
		case CONN_SRC_KEYNUMBER:
			return "KEYNUMBER";
		case CONN_SRC_EG1:
			return "EG1";
		case CONN_SRC_EG2:
			return "EG2";
		case CONN_SRC_PITCHWHEEL:
			return "PITCHWHEEL";
		case CONN_SRC_CC1:
			return "CC1";
		case CONN_SRC_CC7:
			return "CC7";
		case CONN_SRC_CC10:
			return "CC10";
		case CONN_SRC_CC11:
			return "CC11";
		case CONN_SRC_POLYPRESSURE:
			return "POLYPRESSURE";
		case CONN_SRC_CHANNELPRESSURE:
			return "CHANNELPRESSURE";
		case CONN_SRC_VIBRATO:
			return "VIBRATO";
		case CONN_SRC_MONOPRESSURE:
			return "MONOPRESSURE";
		case CONN_SRC_CC91:
			return "CC91";
		case CONN_SRC_CC93:
			return "CC93";
		default:
			mysnprintf(unknown, countof(unknown), "UNKNOWN (0x%04x)", usSource);
			return unknown;
	}
}